

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader-libcurl.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
Downloader_libcurl::download
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Downloader_libcurl *this,string *downloadURL,string *path,
          bool neededWriteBack)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  int *piVar5;
  uint __val;
  int i;
  long lVar6;
  bool bVar7;
  string output;
  string fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream fout;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [31];
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  getFileNameFromURL(&fileName,this,downloadURL);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  _fout = (pointer)local_220;
  local_220[0]._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->second,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  uVar4 = curl_easy_init();
  curl_easy_setopt(uVar4,0x2712,(downloadURL->_M_dataplus)._M_p);
  curl_easy_setopt(uVar4,0x4e2b,fetchDownloadedData);
  curl_easy_setopt(uVar4,0x14,10);
  curl_easy_setopt(uVar4,0x13,0x400);
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  bVar7 = true;
  uVar2 = 0;
  while (bVar7) {
    __val = uVar2 + 1;
    if (uVar2 < 8) {
      std::__cxx11::string::append((char *)&output);
      std::__cxx11::string::append((string *)&output);
      std::__cxx11::string::append((char *)&output);
      std::__cxx11::to_string((string *)&fout,__val);
      std::__cxx11::string::append((string *)&output);
      std::__cxx11::string::~string((string *)&fout);
      std::__cxx11::string::append((char *)&output);
      std::operator<<((ostream *)&std::cout,(string *)&output);
      output._M_string_length = 0;
      *output._M_dataplus._M_p = '\0';
      piVar5 = (int *)operator_new(0x10);
      piVar5[0] = 0;
      piVar5[1] = 1;
      piVar5[2] = 0;
      piVar5[3] = 0;
      curl_easy_setopt(uVar4,0x2711,piVar5);
      iVar3 = curl_easy_perform(uVar4);
      bVar7 = iVar3 != 0;
      if (!bVar7) {
        std::__cxx11::string::append((char *)&output);
        std::__cxx11::string::append((string *)&output);
        std::__cxx11::string::append((char *)&output);
        std::operator<<((ostream *)&std::cout,(string *)&output);
        output._M_string_length = 0;
        *output._M_dataplus._M_p = '\0';
        for (lVar6 = 0; lVar6 < *piVar5; lVar6 = lVar6 + 1) {
          std::__cxx11::string::push_back((char)&__return_storage_ptr__->second);
        }
        if (neededWriteBack) {
          std::operator+(&local_250,path,&__return_storage_ptr__->first);
          std::ofstream::ofstream((string *)&fout,(string *)&local_250,_S_out|_S_bin);
          std::__cxx11::string::~string((string *)&local_250);
          cVar1 = std::__basic_file<char>::is_open();
          if (cVar1 != '\0') {
            std::ostream::write((char *)&fout,
                                (long)(__return_storage_ptr__->second)._M_dataplus._M_p);
          }
          std::ofstream::close();
          std::ofstream::~ofstream((string *)&fout);
        }
      }
      operator_delete(piVar5,0x10);
      uVar2 = __val;
    }
    else {
      std::__cxx11::string::append((char *)&output);
      std::__cxx11::string::append((string *)&output);
      std::__cxx11::string::append((char *)&output);
      std::operator<<((ostream *)&std::cout,(string *)&output);
      output._M_string_length = 0;
      *output._M_dataplus._M_p = '\0';
      bVar7 = false;
      uVar2 = __val;
    }
  }
  curl_easy_cleanup(uVar4);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&fileName);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> Downloader_libcurl::download(const std::string &downloadURL, const std::string &path, bool neededWriteBack)
{
    auto ret = std::pair<std::string, std::string>();

    auto fileName = this->getFileNameFromURL(downloadURL);

    ret.first = fileName;
    ret.second = std::string();

    //curl environment setup
    CURL *curl = curl_easy_init();
    curl_easy_setopt(curl, CURLOPT_URL, downloadURL.c_str());
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, this->fetchDownloadedData);
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, lowSpeedTimeout);
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, lowSpeedBound);

    bool needTry = true;

    int retryCount = 0;
    auto output = std::string();

    while(needTry)
    {
        retryCount++;

        if(retryCount > retryLimit)
        {
            output += "Retry limit exceeded: ";
            output += fileName;
            output += ", download failed\n";
            std::cout << output;
            output.clear();
            needTry = false;
            continue;
        }

        output += "Downloading ";
        output += fileName;
        output += ", retry counter: ";
        output += std::to_string(retryCount);
        output += "\n";
        std::cout << output;
        output.clear();

        //temporary storage allocation
        auto *buf = new memBlockStruc {0, 1, nullptr};

        //download part
        curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *)buf);
        auto err = curl_easy_perform(curl);

        //needTry comes false when download completed or retry limit exceeded
        if(err == CURLE_OK)
        {
            output += "Downloaded ";
            output += fileName;
            output += "\n";
            std::cout << output;
            output.clear();

            for(int i = 0; i < buf->realSize; i++) ret.second += buf->memBlock[i];
            needTry = false;

            if(neededWriteBack)
            {
                std::ofstream fout(path + ret.first, std::ios::out | std::ios::binary);
                if (fout.is_open()) fout.write(ret.second.c_str(), ret.second.length());
                fout.close();
            }
        }

        //temporary storage release
        delete buf;
    }

    //curl exit
    curl_easy_cleanup(curl);

    //return
    return ret;
}